

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O2

void __thiscall DIS::RecordSpecification::marshal(RecordSpecification *this,DataStream *dataStream)

{
  pointer pRVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  RecordSpecificationElement x;
  
  DataStream::operator<<
            (dataStream,
             (uint)(((long)(this->_recordSets).
                           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_recordSets).
                          super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  lVar4 = 8;
  uVar3 = 0;
  while( true ) {
    pRVar1 = (this->_recordSets).
             super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_recordSets).
                       super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x18) <= uVar3)
    break;
    x._vptr_RecordSpecificationElement = (_func_int **)&PTR__RecordSpecificationElement_001c2b30;
    uVar2 = *(undefined8 *)((long)&pRVar1->_vptr_RecordSpecificationElement + lVar4);
    x._16_7_ = SUB87((ulong)*(undefined8 *)
                             ((long)&pRVar1->_vptr_RecordSpecificationElement + lVar4 + 7) >> 8,0);
    x._8_7_ = SUB87(uVar2,0);
    x._recordSetSerialNumber._3_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    RecordSpecificationElement::marshal(&x,dataStream);
    RecordSpecificationElement::~RecordSpecificationElement(&x);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

void RecordSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_recordSets.size();

     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        RecordSpecificationElement x = _recordSets[idx];
        x.marshal(dataStream);
     }

}